

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O3

void rcg::storePointCloud
               (string *name,double f,double t,double scale,shared_ptr<const_rcg::Image> *left,
               shared_ptr<const_rcg::Image> *disp,shared_ptr<const_rcg::Image> *conf,
               shared_ptr<const_rcg::Image> *error)

{
  element_type *peVar1;
  uint64_t uVar2;
  long lVar3;
  undefined1 *puVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  short sVar9;
  ushort uVar10;
  uchar *puVar11;
  uchar *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  pointer puVar16;
  short sVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  size_t i;
  long lVar21;
  long lVar22;
  _Head_base<0UL,_unsigned_char_*,_false> _Var23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar32;
  undefined1 auVar31 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uchar *puVar33;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  short sVar43;
  short sVar44;
  ushort uVar55;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar45;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint8_t rgb [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vindex;
  ofstream out;
  char local_359;
  _Head_base<0UL,_unsigned_char_*,_false> local_358;
  _Head_base<0UL,_unsigned_char_*,_false> local_350;
  _Head_base<0UL,_unsigned_char_*,_false> local_348;
  uchar *local_340;
  pointer local_338;
  ulong local_330;
  long local_328;
  double local_320;
  uint local_314;
  uchar *local_310;
  undefined1 local_308 [16];
  pointer local_2f8;
  double dStack_2f0;
  double local_2e8;
  ulong local_2e0;
  string local_2d8;
  byte bStack_2d7;
  byte bStack_2d6;
  undefined1 uStack_2d5;
  undefined4 uStack_2d4;
  undefined1 local_2c8 [16];
  shared_ptr<const_rcg::Image> *local_2b8;
  long local_2b0;
  long local_2a8;
  shared_ptr<const_rcg::Image> *local_2a0;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> local_298;
  double dStack_290;
  double local_288;
  ulong local_280;
  long local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_270;
  long local_258;
  filebuf local_250 [104];
  ios_base local_1e8 [136];
  ios_base local_160 [264];
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  
  local_308._8_8_ = local_308._0_8_;
  local_308._0_8_ = name;
  peVar1 = (disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var23._M_head_impl =
       *(uchar **)
        &(peVar1->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
  local_330 = peVar1->width;
  puVar12 = (uchar *)peVar1->height;
  local_2e0 = (ulong)peVar1->bigendian;
  local_280 = ((((left->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                width + local_330) - 1) / local_330;
  local_328 = local_330 * 2 + peVar1->xpadding;
  uVar20 = 0;
  local_350._M_head_impl = (uchar *)error;
  local_348._M_head_impl = (uchar *)conf;
  local_338 = (pointer)scale;
  local_320 = t;
  local_2e8 = f;
  local_2b8 = disp;
  local_2a0 = left;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_270,(long)puVar12 * local_330,(allocator_type *)&local_258);
  if (puVar12 != (uchar *)0x0) {
    lVar8 = local_330 + (local_330 == 0);
    puVar11 = (uchar *)0x0;
    puVar16 = local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      lVar14 = 0;
      do {
        puVar16[lVar14] = 0xffffffff;
        if (*(char *)((long)_Var23._M_head_impl + lVar14 * 2 + 1) != '\0' ||
            *(char *)((long)_Var23._M_head_impl + lVar14 * 2) != '\0') {
          puVar16[lVar14] = uVar20;
          uVar20 = uVar20 + 1;
        }
        lVar14 = lVar14 + 1;
      } while (lVar8 != lVar14);
      _Var23._M_head_impl = _Var23._M_head_impl + local_328;
      puVar11 = puVar11 + 1;
      puVar16 = puVar16 + lVar8;
    } while (puVar11 != puVar12);
  }
  local_298.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (((local_2b8->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       pixel)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  local_340 = puVar12;
  dVar25 = ceil(2.0 / (double)local_338);
  local_314 = (uint)dVar25;
  local_358._M_head_impl = (uchar *)0x0;
  if ((uchar *)0x1 < local_340) {
    local_2f8 = (pointer)(local_330 - 1);
    local_358._M_head_impl = (uchar *)0x0;
    puVar12 = (uchar *)0x1;
    _Var23 = local_298.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    do {
      if (1 < local_330) {
        lVar8 = 0;
        puVar16 = local_2f8;
        do {
          lVar15 = lVar8 + 2;
          lVar14 = lVar8 + 1;
          if (local_2e0 != 0) {
            lVar14 = lVar8;
          }
          lVar21 = lVar8 + 3;
          lVar22 = lVar8;
          lVar3 = lVar15;
          if (local_2e0 != 0) {
            lVar21 = lVar15;
            lVar22 = lVar8 + 1;
            lVar3 = lVar8 + 3;
          }
          sVar44 = CONCAT11(_Var23._M_head_impl[lVar14],_Var23._M_head_impl[lVar22]);
          sVar17 = CONCAT11(_Var23._M_head_impl[lVar21],_Var23._M_head_impl[lVar3]);
          uVar10 = CONCAT11(_Var23._M_head_impl[lVar14 + local_328],
                            _Var23._M_head_impl[lVar22 + local_328]);
          sVar9 = CONCAT11(_Var23._M_head_impl[lVar21 + local_328],
                           _Var23._M_head_impl[lVar3 + local_328]);
          uVar18 = CONCAT26(sVar9,CONCAT24(uVar10,CONCAT22(sVar17,sVar44)));
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar18;
          auVar58._0_2_ = -(ushort)(sVar44 == 0);
          auVar58._2_2_ = -(ushort)(sVar44 == 0);
          auVar58._4_2_ = -(ushort)(sVar17 == 0);
          auVar58._6_2_ = -(ushort)(sVar17 == 0);
          auVar58._8_2_ = -(ushort)(uVar10 == 0);
          auVar58._10_2_ = -(ushort)(uVar10 == 0);
          auVar58._12_2_ = -(ushort)(sVar9 == 0);
          auVar58._14_2_ = -(ushort)(sVar9 == 0);
          uVar20 = movmskps((uint)uVar10,auVar58);
          uVar20 = (uint)(0x4332322132212110 >> ((byte)((uVar20 ^ 0xf) << 2) & 0x3f)) & 7;
          if (2 < (byte)uVar20) {
            auVar48._0_2_ = -(ushort)(sVar44 == 0);
            auVar48._2_2_ = -(ushort)(sVar17 == 0);
            auVar48._4_2_ = -(ushort)(uVar10 == 0);
            auVar48._6_2_ = -(ushort)(sVar9 == 0);
            auVar48._8_2_ = 0xffff;
            auVar48._10_2_ = 0xffff;
            auVar48._12_2_ = 0xffff;
            auVar48._14_2_ = 0xffff;
            auVar48 = auVar48 | auVar51;
            uVar32 = auVar48._4_4_;
            auVar56._4_4_ = uVar32;
            auVar56._0_4_ = uVar32;
            auVar56._8_4_ = uVar32;
            auVar56._12_4_ = uVar32;
            auVar58 = psubusw(auVar48,auVar56);
            sVar43 = auVar48._0_2_ - auVar58._0_2_;
            uVar55 = auVar48._2_2_ - auVar58._2_2_;
            auVar46._0_8_ =
                 CONCAT26(auVar48._6_2_ - auVar58._6_2_,
                          CONCAT24(auVar48._4_2_ - auVar58._4_2_,CONCAT22(uVar55,sVar43)));
            auVar46._8_2_ = auVar48._8_2_ - auVar58._8_2_;
            auVar46._10_2_ = auVar48._10_2_ - auVar58._10_2_;
            auVar49._12_2_ = auVar48._12_2_ - auVar58._12_2_;
            auVar49._0_12_ = auVar46;
            auVar49._14_2_ = auVar48._14_2_ - auVar58._14_2_;
            auVar57._2_2_ = 0;
            auVar57._0_2_ = uVar55;
            auVar57._4_4_ = (uint)((ulong)auVar46._0_8_ >> 0x30);
            auVar57._8_4_ = auVar46._8_4_ >> 0x10;
            auVar57._12_4_ = auVar49._12_4_ >> 0x10;
            auVar58 = psubusw(auVar49,auVar57);
            uVar32 = (undefined4)(uVar18 >> 0x20);
            auVar50._4_4_ = uVar32;
            auVar50._0_4_ = uVar32;
            auVar50._8_4_ = uVar32;
            auVar50._12_4_ = uVar32;
            auVar51 = psubusw(auVar50,auVar51);
            sVar44 = auVar51._0_2_ + sVar44;
            uVar55 = auVar51._2_2_ + sVar17;
            auVar47._0_8_ =
                 CONCAT26(auVar51._6_2_ + sVar9,
                          CONCAT24(auVar51._4_2_ + uVar10,CONCAT22(uVar55,sVar44)));
            auVar47._8_2_ = auVar51._8_2_;
            auVar47._10_2_ = auVar51._10_2_;
            auVar52._12_2_ = auVar51._12_2_;
            auVar52._14_2_ = auVar51._14_2_;
            auVar52._0_12_ = auVar47;
            auVar36._2_2_ = 0;
            auVar36._0_2_ = uVar55;
            auVar36._4_4_ = (uint)((ulong)auVar47._0_8_ >> 0x30);
            auVar36._8_4_ = auVar47._8_4_ >> 0x10;
            auVar36._12_4_ = auVar52._12_4_ >> 0x10;
            auVar51 = psubusw(auVar36,auVar52);
            if ((int)((uint)(ushort)(auVar51._0_2_ + sVar44) -
                     (uint)(ushort)(sVar43 - auVar58._0_2_)) <= (int)(local_314 & 0xffff)) {
              local_358._M_head_impl = (uchar *)(ulong)(((int)local_358._M_head_impl + uVar20) - 2);
            }
          }
          puVar16 = (pointer)((long)puVar16 + -1);
          lVar8 = lVar15;
        } while (puVar16 != (pointer)0x0);
      }
      _Var23._M_head_impl = _Var23._M_head_impl + local_328;
      puVar12 = puVar12 + 1;
    } while (puVar12 != local_340);
  }
  peVar1 = ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)local_348._M_head_impl)->
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_348._M_head_impl = (uchar *)0x0;
    local_2a8 = 0;
  }
  else {
    local_348._M_head_impl =
         *(uchar **)
          &(peVar1->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2a8 = peVar1->xpadding + peVar1->width;
  }
  peVar1 = ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)local_350._M_head_impl)->
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_350._M_head_impl = (uchar *)0x0;
    local_2b0 = 0;
  }
  else {
    local_350._M_head_impl =
         *(uchar **)
          &(peVar1->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2b0 = peVar1->xpadding + peVar1->width;
  }
  if (*(long *)(local_308._0_8_ + 8) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
    uVar2 = ((local_2a0->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            timestamp;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"rc_visard_",10);
    auVar37._8_4_ = (int)(uVar2 >> 0x20);
    auVar37._0_8_ = uVar2;
    auVar37._12_4_ = 0x45300000;
    *(undefined8 *)(local_250 + *(long *)(local_258 + -0x18)) = 0x10;
    poVar5 = std::ostream::_M_insert<double>
                       (((auVar37._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                        1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".ply",4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_308._0_8_,&local_2d8);
    puVar4 = (undefined1 *)
             CONCAT44(uStack_2d4,
                      CONCAT13(uStack_2d5,CONCAT12(bStack_2d6,CONCAT11(bStack_2d7,local_2d8))));
    if (puVar4 != local_2c8) {
      operator_delete(puVar4);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
    std::ios_base::~ios_base(local_1e8);
  }
  std::ofstream::ofstream(&local_258,(string *)local_308._0_8_,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"ply",3);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"format ascii 1.0",0x10);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"comment Created with gc_pointcloud from Roboception GmbH",0x38);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]",0x2c);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"element vertex ",0xf);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property float32 x",0x12);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property float32 y",0x12);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property float32 z",0x12);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property float32 scan_size",0x1a);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  if (local_348._M_head_impl != (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"property float32 scan_conf",0x1a);
    std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
    std::ostream::put((char)&local_258);
    std::ostream::flush();
  }
  if (local_350._M_head_impl != (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"property float32 scan_error",0x1b);
    std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
    std::ostream::put((char)&local_258);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property uint8 diffuse_red",0x1a);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property uint8 diffuse_green",0x1c);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property uint8 diffuse_blue",0x1b);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"element face ",0xd);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&local_258,(int)local_358._M_head_impl);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"property list uint8 uint32 vertex_indices",0x29);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"end_header",10);
  std::ios::widen((char)(ostream *)&local_258 + (char)*(undefined8 *)(local_258 + -0x18));
  std::ostream::put((char)&local_258);
  std::ostream::flush();
  if (local_340 != (uchar *)0x0) {
    auVar26._8_4_ = (int)(local_330 >> 0x20);
    auVar26._0_8_ = local_330;
    auVar26._12_4_ = 0x45300000;
    dVar25 = auVar26._8_8_ - 1.9342813113834067e+25;
    dVar45 = dVar25 + ((double)CONCAT44(0x43300000,(int)local_330) - 4503599627370496.0);
    local_2e8 = local_2e8 * dVar45;
    auVar27._0_8_ = (double)CONCAT44(0x43300000,(int)local_340);
    auVar27._8_4_ = (int)((ulong)local_340 >> 0x20);
    auVar27._12_4_ = 0x45300000;
    dStack_50 = auVar27._8_8_ - 1.9342813113834067e+25;
    local_288 = local_2e8 * local_320;
    local_278 = local_330 + (local_330 == 0);
    local_310 = (uchar *)((long)local_298.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl
                         + (ulong)(byte)((byte)local_2e0 ^ 1));
    puVar11 = (uchar *)((long)local_298.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                       local_2e0);
    puVar12 = (uchar *)0x0;
    local_58 = (dStack_50 + (auVar27._0_8_ - 4503599627370496.0)) * -0.5;
    local_48._0_8_ = dVar45 * -0.5;
    local_48._8_8_ = dVar25;
    do {
      auVar28._8_4_ = (int)((ulong)puVar12 >> 0x20);
      auVar28._0_8_ = puVar12;
      auVar28._12_4_ = 0x45300000;
      dStack_290 = auVar28._8_8_ - 1.9342813113834067e+25;
      local_298.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Head_base<0UL,_unsigned_char_*,_false>)
           ((dStack_290 + ((double)CONCAT44(0x43300000,(uint32_t)puVar12) - 4503599627370496.0) +
             0.5 + local_58) * local_320);
      lVar8 = 0;
      do {
        puVar33 = (uchar *)((double)CONCAT11(local_310[lVar8 * 2],puVar11[lVar8 * 2]) *
                           (double)local_338);
        if (((double)puVar33 != 0.0) || (NAN((double)puVar33))) {
          auVar29._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar29._0_8_ = lVar8;
          auVar29._12_4_ = 0x45300000;
          dStack_2f0 = auVar29._8_8_ - 1.9342813113834067e+25;
          dVar25 = dStack_2f0 + ((double)CONCAT44(0x43300000,(uint32_t)lVar8) - 4503599627370496.0);
          local_2f8 = (pointer)(((dVar25 + 0.5 + (double)local_48._0_8_) * local_320) /
                               (double)puVar33);
          local_308._8_8_ = local_48._8_8_ & 0x7fffffffffffffff;
          local_308._0_8_ =
               ABS((((double)local_48._0_8_ + dVar25) * local_320) / (double)puVar33 -
                   (double)local_2f8) * 2.8;
          local_358._M_head_impl = puVar33;
          getColor((uint8_t *)&local_2d8,local_2a0,(uint32_t)local_280,(uint32_t)lVar8,
                   (uint32_t)puVar12);
          poVar5 = std::ostream::_M_insert<double>((double)local_2f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::ostream::_M_insert<double>
                             ((double)local_298.super__Head_base<0UL,_unsigned_char_*,_false>.
                                      _M_head_impl / (double)local_358._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::ostream::_M_insert<double>(local_288 / (double)local_358._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::ostream::_M_insert<double>((double)local_308._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          if (local_348._M_head_impl != (uchar *)0x0) {
            poVar5 = std::ostream::_M_insert<double>((double)local_348._M_head_impl[lVar8] / 255.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          }
          if (local_350._M_head_impl != (uchar *)0x0) {
            poVar5 = std::ostream::_M_insert<double>
                               (((double)local_350._M_head_impl[lVar8] * (double)local_338 *
                                 local_2e8 * local_320) /
                                ((double)local_358._M_head_impl * (double)local_358._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          }
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_258,(uint)(byte)local_2d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_258,(uint)bStack_2d7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          plVar6 = (long *)std::ostream::operator<<((ostream *)&local_258,(uint)bStack_2d6);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
        }
        lVar8 = lVar8 + 1;
      } while (local_278 != lVar8);
      local_348._M_head_impl = local_348._M_head_impl + local_2a8;
      local_350._M_head_impl = local_350._M_head_impl + local_2b0;
      puVar12 = puVar12 + 1;
      local_310 = local_310 + local_328;
      puVar11 = puVar11 + local_328;
    } while (puVar12 != local_340);
    if ((uchar *)0x1 < local_340) {
      local_358._M_head_impl =
           *(uchar **)
            &(((local_2b8->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->pixel)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
      local_308._0_4_ = local_314 & 0xffff;
      local_310 = (uchar *)(local_330 - 1);
      local_320 = (double)(local_330 * 4);
      local_338 = local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_2f8 = local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + local_330 + 1;
      puVar12 = (uchar *)0x1;
      do {
        lVar8 = local_328;
        _Var23._M_head_impl = local_358._M_head_impl;
        local_350._M_head_impl = puVar12;
        if (1 < local_330) {
          lVar14 = 0;
          puVar12 = local_310;
          do {
            lVar22 = lVar14 + 2;
            lVar15 = lVar14;
            if (local_2e0 != 0) {
              lVar15 = lVar14 + 1;
            }
            lVar13 = lVar14 + 3;
            lVar3 = lVar14 + 1;
            lVar21 = lVar22;
            if (local_2e0 != 0) {
              lVar13 = lVar22;
              lVar3 = lVar14;
              lVar21 = lVar14 + 3;
            }
            sVar44 = CONCAT11(local_358._M_head_impl[lVar3],local_358._M_head_impl[lVar15]);
            sVar17 = CONCAT11(local_358._M_head_impl[lVar13],local_358._M_head_impl[lVar21]);
            sVar9 = CONCAT11(*(undefined1 *)((long)_Var23._M_head_impl + lVar3 + lVar8),
                             *(undefined1 *)((long)_Var23._M_head_impl + lVar15 + lVar8));
            iVar7 = (uint)*(byte *)((long)_Var23._M_head_impl + lVar13 + lVar8) << 8;
            uVar10 = (ushort)*(byte *)((long)_Var23._M_head_impl + lVar21 + lVar8) | (ushort)iVar7;
            uVar18 = CONCAT26(uVar10,CONCAT24(sVar9,CONCAT22(sVar17,sVar44)));
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar18;
            auVar38._0_2_ = -(ushort)(sVar44 == 0);
            auVar38._2_2_ = -(ushort)(sVar44 == 0);
            auVar38._4_2_ = -(ushort)(sVar17 == 0);
            auVar38._6_2_ = -(ushort)(sVar17 == 0);
            auVar38._8_2_ = -(ushort)(sVar9 == 0);
            auVar38._10_2_ = -(ushort)(sVar9 == 0);
            auVar38._12_2_ = -(ushort)(uVar10 == 0);
            auVar38._14_2_ = -(ushort)(uVar10 == 0);
            uVar20 = movmskps(iVar7,auVar38);
            if (2 < ((byte)(0x4332322132212110 >> ((byte)((uVar20 ^ 0xf) << 2) & 0x3f)) & 7)) {
              auVar39._0_2_ = -(ushort)(sVar44 == 0);
              auVar39._2_2_ = -(ushort)(sVar17 == 0);
              auVar39._4_2_ = -(ushort)(sVar9 == 0);
              auVar39._6_2_ = -(ushort)(uVar10 == 0);
              auVar39._8_2_ = 0xffff;
              auVar39._10_2_ = 0xffff;
              auVar39._12_2_ = 0xffff;
              auVar39._14_2_ = 0xffff;
              auVar39 = auVar39 | auVar30;
              uVar32 = auVar39._4_4_;
              auVar53._4_4_ = uVar32;
              auVar53._0_4_ = uVar32;
              auVar53._8_4_ = uVar32;
              auVar53._12_4_ = uVar32;
              auVar51 = psubusw(auVar39,auVar53);
              sVar43 = auVar39._0_2_ - auVar51._0_2_;
              uVar55 = auVar39._2_2_ - auVar51._2_2_;
              auVar34._0_8_ =
                   CONCAT26(auVar39._6_2_ - auVar51._6_2_,
                            CONCAT24(auVar39._4_2_ - auVar51._4_2_,CONCAT22(uVar55,sVar43)));
              auVar34._8_2_ = auVar39._8_2_ - auVar51._8_2_;
              auVar34._10_2_ = auVar39._10_2_ - auVar51._10_2_;
              auVar40._12_2_ = auVar39._12_2_ - auVar51._12_2_;
              auVar40._0_12_ = auVar34;
              auVar40._14_2_ = auVar39._14_2_ - auVar51._14_2_;
              auVar54._2_2_ = 0;
              auVar54._0_2_ = uVar55;
              auVar54._4_4_ = (uint)((ulong)auVar34._0_8_ >> 0x30);
              auVar54._8_4_ = auVar34._8_4_ >> 0x10;
              auVar54._12_4_ = auVar40._12_4_ >> 0x10;
              auVar58 = psubusw(auVar40,auVar54);
              uVar32 = (undefined4)(uVar18 >> 0x20);
              auVar41._4_4_ = uVar32;
              auVar41._0_4_ = uVar32;
              auVar41._8_4_ = uVar32;
              auVar41._12_4_ = uVar32;
              auVar51 = psubusw(auVar41,auVar30);
              sVar44 = auVar51._0_2_ + sVar44;
              uVar55 = auVar51._2_2_ + sVar17;
              auVar35._0_8_ =
                   CONCAT26(auVar51._6_2_ + uVar10,
                            CONCAT24(auVar51._4_2_ + sVar9,CONCAT22(uVar55,sVar44)));
              auVar35._8_2_ = auVar51._8_2_;
              auVar35._10_2_ = auVar51._10_2_;
              auVar42._12_2_ = auVar51._12_2_;
              auVar42._14_2_ = auVar51._14_2_;
              auVar42._0_12_ = auVar35;
              auVar31._2_2_ = 0;
              auVar31._0_2_ = uVar55;
              auVar31._4_4_ = (uint)((ulong)auVar35._0_8_ >> 0x30);
              auVar31._8_4_ = auVar35._8_4_ >> 0x10;
              auVar31._12_4_ = auVar42._12_4_ >> 0x10;
              auVar51 = psubusw(auVar31,auVar42);
              if ((int)((uint)(ushort)(auVar51._0_2_ + sVar44) -
                       (uint)(ushort)(sVar43 - auVar58._0_2_)) <= (int)local_308._0_4_) {
                iVar7 = *(int *)((long)local_338 + lVar14 * 2);
                bVar24 = iVar7 != -1;
                if (bVar24) {
                  local_2d8 = SUB41(iVar7,0);
                  bStack_2d7 = (byte)((uint)iVar7 >> 8);
                  bStack_2d6 = (byte)((uint)iVar7 >> 0x10);
                  uStack_2d5 = (undefined1)((uint)iVar7 >> 0x18);
                }
                iVar7 = *(int *)((long)local_2f8 + lVar14 * 2 + -4);
                uVar18 = (ulong)bVar24;
                if (iVar7 != -1) {
                  uVar18 = (ulong)(bVar24 + 1);
                  *(int *)(&local_2d8 + (ulong)bVar24 * 4) = iVar7;
                }
                iVar7 = *(int *)((long)local_2f8 + lVar14 * 2);
                uVar19 = uVar18;
                if (iVar7 != -1) {
                  uVar19 = (ulong)((int)uVar18 + 1);
                  *(int *)(&local_2d8 + uVar18 * 4) = iVar7;
                }
                iVar7 = *(int *)((long)local_338 + lVar14 * 2 + 4);
                uVar18 = uVar19;
                if (iVar7 != -1) {
                  uVar18 = (ulong)((int)uVar19 + 1);
                  *(int *)(&local_2d8 + uVar19 * 4) = iVar7;
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"3 ",2);
                local_348._M_head_impl =
                     (uchar *)(ulong)CONCAT13(uStack_2d5,
                                              CONCAT12(bStack_2d6,CONCAT11(bStack_2d7,local_2d8)));
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
                local_359 = ' ';
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_359,1);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                local_359 = ' ';
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_359,1);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
                if ((int)uVar18 == 4) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"3 ",2);
                  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
                  local_359 = ' ';
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_359,1);
                  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                  local_359 = ' ';
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_359,1);
                  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                }
              }
            }
            puVar12 = puVar12 + -1;
            lVar14 = lVar22;
          } while (puVar12 != (uchar *)0x0);
        }
        local_358._M_head_impl = local_358._M_head_impl + local_328;
        puVar12 = local_350._M_head_impl + 1;
        local_338 = (pointer)((long)local_338 + (long)local_320);
        local_2f8 = (pointer)((long)local_2f8 + (long)local_320);
      } while (puVar12 != local_340);
    }
  }
  std::ofstream::close();
  local_258 = _VTT;
  *(undefined8 *)(local_250 + *(long *)(_VTT + -0x18) + -8) = _png_destroy_write_struct;
  std::filebuf::~filebuf(local_250);
  std::ios_base::~ios_base(local_160);
  if (local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void storePointCloud(std::string name, double f, double t, double scale,
                     std::shared_ptr<const Image> left,
                     std::shared_ptr<const Image> disp,
                     std::shared_ptr<const Image> conf,
                     std::shared_ptr<const Image> error)
{
  // get size and scale factor between left image and disparity image

  size_t width=disp->getWidth();
  size_t height=disp->getHeight();
  bool bigendian=disp->isBigEndian();
  size_t ds=(left->getWidth()+disp->getWidth()-1)/disp->getWidth();

  // convert focal length factor into focal length in (disparity) pixels

  f*=width;

  // get pointer to disparity data and size of row in bytes

  const uint8_t *dps=disp->getPixels();
  size_t dstep=disp->getWidth()*sizeof(uint16_t)+disp->getXPadding();

  // count number of valid disparities and store vertice index in a temporary
  // index image

  size_t vi=0;
  const uint32_t vinvalid=0xffffffff;
  std::vector<uint32_t> vindex(width*height);

  uint32_t n=0;
  for (size_t k=0; k<height; k++)
  {
    int j=0;
    for (size_t i=0; i<width; i++)
    {
      vindex[vi]=vinvalid;
      if ((dps[j]|dps[j+1]) != 0) vindex[vi]=n++;

      j+=2;
      vi++;
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // count number of triangles

  const uint16_t vstep=static_cast<uint16_t>(std::ceil(2/scale));

  int tn=0;
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        tn+=valid-2;
      }
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // get pointer to optional confidence and error data and size of row in bytes

  const uint8_t *cps=0, *eps=0;
  size_t cstep=0, estep=0;

  if (conf)
  {
    cps=conf->getPixels();
    cstep=conf->getWidth()*sizeof(uint8_t)+conf->getXPadding();
  }

  if (error)
  {
    eps=error->getPixels();
    estep=error->getWidth()*sizeof(uint8_t)+error->getXPadding();
  }

  // open output file and write ASCII PLY header

  if (name.size() == 0)
  {
    std::ostringstream os;
    double timestamp=left->getTimestampNS()/1000000000.0;
    os << "rc_visard_" << std::setprecision(16) << timestamp << ".ply";
    name=os.str();
  }

  std::ofstream out(name);

  out << "ply" << std::endl;
  out << "format ascii 1.0" << std::endl;
  out << "comment Created with gc_pointcloud from Roboception GmbH" << std::endl;
  out << "comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]" << std::endl;
  out << "element vertex " << n << std::endl;
  out << "property float32 x" << std::endl;
  out << "property float32 y" << std::endl;
  out << "property float32 z" << std::endl;
  out << "property float32 scan_size" << std::endl; // i.e. size of 3D point

  if (cps != 0)
  {
    out << "property float32 scan_conf" << std::endl; // optional confidence
  }

  if (eps != 0)
  {
    out << "property float32 scan_error" << std::endl; // optional error in 3D along line of sight
  }

  out << "property uint8 diffuse_red" << std::endl;
  out << "property uint8 diffuse_green" << std::endl;
  out << "property uint8 diffuse_blue" << std::endl;
  out << "element face " << tn << std::endl;
  out << "property list uint8 uint32 vertex_indices" << std::endl;
  out << "end_header" << std::endl;

  // create colored point cloud

  for (size_t k=0; k<height; k++)
  {
    for (size_t i=0; i<width; i++)
    {
      // convert disparity from fixed comma 16 bit integer into float value

      double d=scale*getUint16(dps, bigendian, i);

      // if disparity is valid and color can be obtained

      if (d)
      {
        // reconstruct 3D point from disparity value

        double x=(i+0.5-0.5*width)*t/d;
        double y=(k+0.5-0.5*height)*t/d;
        double z=f*t/d;

        // compute size of reconstructed point

        double x2=(i-0.5*width)*t/d;
        double size=2*1.4*std::abs(x2-x);

        // get corresponding color value

        uint8_t rgb[3];
        getColor(rgb, left, static_cast<uint32_t>(ds), static_cast<uint32_t>(i),
                 static_cast<uint32_t>(k));

        // store colored point, optionally with confidence and error

        out << x << " " << y << " " << z << " " << size << " ";

        if (cps != 0)
        {
          out << cps[i]/255.0 << " ";
        }

        if (eps != 0)
        {
          out << eps[i]*scale*f*t/(d*d) << " ";
        }

        out << static_cast<int>(rgb[0]) << " ";
        out << static_cast<int>(rgb[1]) << " ";
        out << static_cast<int>(rgb[2]) << std::endl;
      }
    }

    dps+=dstep;
    cps+=cstep;
    eps+=estep;
  }

  dps=disp->getPixels();

  // create triangles

  uint32_t *ips=vindex.data();
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        int j=0;
        uint32_t fc[4];

        if (ips[i-1] != vinvalid)
        {
          fc[j++]=ips[i-1];
        }

        if (ips[width+i-1] != vinvalid)
        {
          fc[j++]=ips[width+i-1];
        }

        if (ips[width+i] != vinvalid)
        {
          fc[j++]=ips[width+i];
        }

        if (ips[i] != vinvalid)
        {
          fc[j++]=ips[i];
        }

        out << "3 " << fc[0] << ' ' << fc[1] << ' ' << fc[2] << std::endl;

        if (j == 4)
        {
          out << "3 " << fc[2] << ' ' << fc[3] << ' ' << fc[0] << std::endl;
        }
      }
    }

    ips+=width;
    dps+=dstep;
  }

  out.close();
}